

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofXyz.cpp
# Opt level: O3

void __thiscall OpenMD::GofXyz::initializeHistogram(GofXyz *this)

{
  SelectionManager *this_00;
  undefined4 *puVar1;
  char cVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  uint i_1;
  StuntDouble *this_01;
  StuntDouble *pSVar6;
  pair<const_int,_OpenMD::SquareMatrix3<double>_> *ppVar7;
  uint i_3;
  uint i_2;
  pair<const_int,_OpenMD::SquareMatrix3<double>_> *ppVar8;
  double *pdVar9;
  long lVar10;
  SquareMatrix3<double> *pSVar11;
  long lVar12;
  double (*__return_storage_ptr__) [3];
  byte bVar13;
  double tmp;
  Vector<double,_3U> result_1;
  int j;
  int i;
  Vector3<double> result_3;
  MultipoleAdapter ma1;
  SquareMatrix3<double> result;
  undefined8 local_198;
  undefined8 uStack_190;
  double local_188;
  int local_180;
  int local_17c;
  undefined8 local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  double local_168;
  double local_158 [4];
  _Rb_tree<int,std::pair<int_const,OpenMD::SquareMatrix3<double>>,std::_Select1st<std::pair<int_const,OpenMD::SquareMatrix3<double>>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::SquareMatrix3<double>>>>
  *local_138;
  MultipoleAdapter local_130;
  pair<const_int,_OpenMD::SquareMatrix3<double>_> local_128;
  Vector3d local_d8;
  double local_b8 [4];
  double local_98 [4];
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double dStack_58;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  double local_38;
  
  bVar13 = 0;
  if ((this->evaluator3_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_128,&this->evaluator3_);
    lVar12 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan3_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar12),
                 (vector<bool,_std::allocator<bool>_> *)(local_128._0_8_ + lVar12));
      lVar12 = lVar12 + 0x28;
    } while (lVar12 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_128);
  }
  cVar2 = (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->simParams_->
          UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  local_138 = (_Rb_tree<int,std::pair<int_const,OpenMD::SquareMatrix3<double>>,std::_Select1st<std::pair<int_const,OpenMD::SquareMatrix3<double>>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::SquareMatrix3<double>>>>
               *)&this->rotMats_;
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMD::SquareMatrix3<double>_>,_std::_Select1st<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_OpenMD::SquareMatrix3<double>_>,_std::_Select1st<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
           *)local_138);
  this_00 = &(this->super_RadialDistrFunc).seleMan1_;
  this_01 = SelectionManager::beginSelected(this_00,&local_17c);
  pSVar6 = SelectionManager::beginSelected(&this->seleMan3_,&local_180);
  if (pSVar6 != (StuntDouble *)0x0 || this_01 != (StuntDouble *)0x0) {
    do {
      lVar12 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
      local_98[2] = (double)*(undefined8 *)(lVar12 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
      pdVar9 = (double *)(lVar12 + (long)pSVar6->localIndex_ * 0x18);
      local_98[0] = *pdVar9;
      local_98[1] = pdVar9[1];
      lVar12 = *(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
      local_b8[2] = (double)*(undefined8 *)(lVar12 + 0x10 + (long)this_01->localIndex_ * 0x18);
      pdVar9 = (double *)(lVar12 + (long)this_01->localIndex_ * 0x18);
      local_b8[0] = *pdVar9;
      local_b8[1] = pdVar9[1];
      local_128._0_8_ = 0.0;
      local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           0.0;
      local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
           0.0;
      lVar12 = 0;
      do {
        *(double *)
         ((long)(local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                 data_ + -1) + 0x10U + lVar12 * 8) = local_98[lVar12] - local_b8[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_d8.super_Vector<double,_3U>.data_[2] =
           local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
           [1];
      local_d8.super_Vector<double,_3U>.data_[0] = (double)local_128._0_8_;
      local_d8.super_Vector<double,_3U>.data_[1] =
           local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
           [0];
      if (cVar2 != '\0') {
        Snapshot::wrapVector
                  (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->sman_->
                   currentSnapshot_,&local_d8);
      }
      local_130.at_ = (AtomType *)this_01[1]._vptr_StuntDouble;
      bVar5 = MultipoleAdapter::isDipole(&local_130);
      if (bVar5) {
        lVar12 = *(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).dipole.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
        local_168 = *(double *)(lVar12 + 0x10 + (long)this_01->localIndex_ * 0x18);
        puVar1 = (undefined4 *)(lVar12 + (long)this_01->localIndex_ * 0x18);
        local_198._0_4_ = *puVar1;
        local_198._4_4_ = puVar1[1];
        uStack_190._0_4_ = puVar1[2];
        uStack_190._4_4_ = puVar1[3];
      }
      else {
        __return_storage_ptr__ = (double (*) [3])&local_78;
        StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,this_01);
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
             = 0.0;
        local_128._0_8_ = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
             = 0.0;
        local_128.second.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1]
             = 0.0;
        ppVar7 = &local_128;
        lVar12 = 0;
        do {
          lVar10 = 0;
          ppVar8 = ppVar7;
          do {
            *(double *)ppVar8 =
                 (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                 super_RectMatrix<double,_3U,_3U>).data_[0][lVar10];
            lVar10 = lVar10 + 1;
            ppVar8 = (pair<const_int,_OpenMD::SquareMatrix3<double>_> *)
                     ((ppVar8->second).super_SquareMatrix<double,_3>.
                      super_RectMatrix<double,_3U,_3U>.data_[0] + 2);
          } while (lVar10 != 3);
          lVar12 = lVar12 + 1;
          ppVar7 = (pair<const_int,_OpenMD::SquareMatrix3<double>_> *)&ppVar7->second;
          __return_storage_ptr__ = __return_storage_ptr__ + 1;
        } while (lVar12 != 3);
        local_198 = 0.0;
        uStack_190 = 0.0;
        local_188 = 0.0;
        ppVar7 = &local_128;
        lVar12 = 0;
        do {
          dVar3 = (double)(&local_198)[lVar12];
          lVar10 = 0;
          do {
            dVar3 = dVar3 + *(double *)
                             ((long)((ppVar7->second).super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_ + -1) + 0x10U + lVar10)
                            * *(double *)((long)&OpenMD::V3Z + lVar10);
            lVar10 = lVar10 + 8;
          } while (lVar10 != 0x18);
          (&local_198)[lVar12] = dVar3;
          lVar12 = lVar12 + 1;
          ppVar7 = (pair<const_int,_OpenMD::SquareMatrix3<double>_> *)
                   ((ppVar7->second).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                    data_[0] + 2);
        } while (lVar12 != 3);
        local_168 = local_188;
      }
      local_178._0_4_ = (undefined4)local_198;
      local_178._4_4_ = local_198._4_4_;
      uStack_170 = (undefined4)uStack_190;
      uStack_16c = uStack_190._4_4_;
      dVar3 = (double)CONCAT44(local_198._4_4_,(undefined4)local_198);
      dVar4 = (double)CONCAT44(uStack_190._4_4_,(undefined4)uStack_190);
      local_198 = local_d8.super_Vector<double,_3U>.data_[1] * local_168 -
                  local_d8.super_Vector<double,_3U>.data_[2] * dVar4;
      uStack_190 = local_d8.super_Vector<double,_3U>.data_[2] * dVar3 -
                   local_d8.super_Vector<double,_3U>.data_[0] * local_168;
      local_188 = local_d8.super_Vector<double,_3U>.data_[0] * dVar4 -
                  dVar3 * local_d8.super_Vector<double,_3U>.data_[1];
      local_158[0] = local_188 * dVar4 - uStack_190 * local_168;
      local_158[1] = local_198 * local_168 - local_188 * dVar3;
      local_158[2] = uStack_190 * dVar3 - local_198 * dVar4;
      dVar3 = 0.0;
      lVar12 = 0;
      do {
        dVar3 = dVar3 + (double)(&local_198)[lVar12] * (double)(&local_198)[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      lVar12 = 0;
      do {
        (&local_198)[lVar12] = (double)(&local_198)[lVar12] / dVar3;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      dVar3 = 0.0;
      lVar12 = 0;
      do {
        dVar3 = dVar3 + local_158[lVar12] * local_158[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      lVar12 = 0;
      do {
        local_158[lVar12] = local_158[lVar12] / dVar3;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      dVar3 = 0.0;
      lVar12 = 0;
      do {
        dVar3 = dVar3 + (double)(&local_178)[lVar12] * (double)(&local_178)[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      lVar12 = 0;
      do {
        (&local_178)[lVar12] = (double)(&local_178)[lVar12] / dVar3;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_68 = local_188;
      local_78 = local_198;
      dStack_70 = uStack_190;
      local_50 = local_158[2];
      local_60 = local_158[0];
      dStack_58 = local_158[1];
      local_38 = local_168;
      local_48 = CONCAT44(local_178._4_4_,(undefined4)local_178);
      uStack_40 = CONCAT44(uStack_16c,uStack_170);
      local_128.first = this_01->globalIndex_;
      pdVar9 = &local_78;
      pSVar11 = &local_128.second;
      for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pSVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] =
             *pdVar9;
        pdVar9 = pdVar9 + (ulong)bVar13 * -2 + 1;
        pSVar11 = (SquareMatrix3<double> *)((long)pSVar11 + ((ulong)bVar13 * -2 + 1) * 8);
      }
      std::
      _Rb_tree<int,std::pair<int_const,OpenMD::SquareMatrix3<double>>,std::_Select1st<std::pair<int_const,OpenMD::SquareMatrix3<double>>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::SquareMatrix3<double>>>>
      ::_M_insert_unique<std::pair<int_const,OpenMD::SquareMatrix3<double>>>(local_138,&local_128);
      this_01 = SelectionManager::nextSelected(this_00,&local_17c);
      pSVar6 = SelectionManager::nextSelected(&this->seleMan3_,&local_180);
    } while (pSVar6 != (StuntDouble *)0x0 || this_01 != (StuntDouble *)0x0);
  }
  return;
}

Assistant:

void GofXyz::initializeHistogram() {
    // Calculate the center of mass of the molecule of selected
    // StuntDouble in selection1

    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    assert(seleMan1_.getSelectionCount() == seleMan3_.getSelectionCount());
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    // The Dipole direction of selection3 and position of selection3 will
    // be used to determine the y-z plane
    // v1 = s3 -s1,
    // z = origin.dipole
    // x = v1 X z
    // y = z X x
    rotMats_.clear();

    int i;
    int j;
    StuntDouble* sd1;
    StuntDouble* sd3;

    for (sd1 = seleMan1_.beginSelected(i), sd3 = seleMan3_.beginSelected(j);
         sd1 != NULL || sd3 != NULL;
         sd1 = seleMan1_.nextSelected(i), sd3 = seleMan3_.nextSelected(j)) {
      Vector3d r3 = sd3->getPos();
      Vector3d r1 = sd1->getPos();
      Vector3d v1 = r3 - r1;
      if (usePeriodicBoundaryConditions_)
        info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(v1);

      AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
      MultipoleAdapter ma1 = MultipoleAdapter(atype1);

      Vector3d zaxis;
      if (ma1.isDipole())
        zaxis = sd1->getDipole();
      else
        zaxis = sd1->getA().transpose() * V3Z;

      Vector3d xaxis = cross(v1, zaxis);
      Vector3d yaxis = cross(zaxis, xaxis);

      xaxis.normalize();
      yaxis.normalize();
      zaxis.normalize();

      RotMat3x3d rotMat;
      rotMat.setRow(0, xaxis);
      rotMat.setRow(1, yaxis);
      rotMat.setRow(2, zaxis);

      rotMats_.insert(
          std::map<int, RotMat3x3d>::value_type(sd1->getGlobalIndex(), rotMat));
    }
  }